

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyalloc.c
# Opt level: O3

void * tommy_allocator_alloc(tommy_allocator *alloc)

{
  long lVar1;
  ulong uVar2;
  tommy_allocator_entry_struct *ptVar3;
  tommy_allocator_entry_struct *ptVar4;
  tommy_allocator_entry_struct *ptVar5;
  long lVar6;
  size_t size;
  ulong uVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar3 = alloc->free_block;
  if (ptVar3 == (tommy_allocator_entry_struct *)0x0) {
    uVar2 = alloc->block_size + alloc->align_size + 8;
    size = 0xfc0;
    if (0xfc0 < uVar2) {
      size = uVar2;
    }
    ptVar3 = (tommy_allocator_entry_struct *)lrtr_malloc(size);
    ptVar3->next = alloc->used_segment;
    alloc->used_segment = ptVar3;
    uVar2 = (ulong)(ptVar3 + 1) % alloc->align_size;
    lVar6 = alloc->align_size - uVar2;
    if (uVar2 == 0) {
      lVar6 = 0;
    }
    uVar7 = size - lVar6;
    uVar2 = alloc->block_size;
    ptVar3 = (tommy_allocator_entry_struct *)((long)&ptVar3[1].next + lVar6);
    ptVar4 = alloc->free_block;
    do {
      ptVar5 = ptVar4;
      ptVar4 = ptVar3;
      ptVar4->next = ptVar5;
      ptVar3 = (tommy_allocator_entry_struct *)((long)&ptVar4->next + uVar2);
      uVar7 = uVar7 - uVar2;
    } while (uVar2 <= uVar7);
    ptVar3 = (tommy_allocator_entry_struct *)((long)ptVar3 - uVar2);
  }
  else {
    ptVar5 = ptVar3->next;
  }
  alloc->free_block = ptVar5;
  alloc->count = alloc->count + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ptVar3;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_allocator_alloc(tommy_allocator* alloc)
{
	void* ptr;

	/* if no free block available */
	if (!alloc->free_block) {
		tommy_uintptr_t off, mis;
		tommy_size_t size;
		char* data;
		tommy_allocator_entry* segment;

		/* default allocation size */
		size = TOMMY_ALLOCATOR_BLOCK_SIZE;

		/* ensure that we can allocate at least one block */
		if (size < sizeof(tommy_allocator_entry) + alloc->align_size + alloc->block_size)
			size = sizeof(tommy_allocator_entry) + alloc->align_size + alloc->block_size;

		data = tommy_cast(char*, tommy_malloc(size));
		segment = (tommy_allocator_entry*)data;

		/* put in the segment list */
		segment->next = alloc->used_segment;
		alloc->used_segment = segment;
		data += sizeof(tommy_allocator_entry);

		/* align if not aligned */
		off = (tommy_uintptr_t)data;
		mis = off % alloc->align_size;
		if (mis != 0) {
			data += alloc->align_size - mis;
			size -= alloc->align_size - mis;
		}

		/* insert in free list */
		do {
			tommy_allocator_entry* free_block = (tommy_allocator_entry*)data;
			free_block->next = alloc->free_block;
			alloc->free_block = free_block;

			data += alloc->block_size;
			size -= alloc->block_size;
		} while (size >= alloc->block_size);
	}

	/* remove one from the free list */
	ptr = alloc->free_block;
	alloc->free_block = alloc->free_block->next;

	++alloc->count;

	return ptr;
}